

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

P<r_code::Code> * __thiscall
r_code::vector<core::P<r_code::Code>_>::operator[](vector<core::P<r_code::Code>_> *this,size_t i)

{
  reference pvVar1;
  
  if ((ulong)((long)(this->m_vector).
                    super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vector).
                    super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) <= i) {
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::resize
              (&this->m_vector,i + 1);
  }
  pvVar1 = std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::at
                     (&this->m_vector,i);
  return pvVar1;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }